

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  uint local_34;
  uint i;
  Atom atom;
  char *atomName_local;
  unsigned_long atomCount_local;
  Atom *supportedAtoms_local;
  
  AVar1 = XInternAtom(_glfw.x11.display,atomName,0);
  local_34 = 0;
  while( true ) {
    if (atomCount <= local_34) {
      return 0;
    }
    if (supportedAtoms[local_34] == AVar1) break;
    local_34 = local_34 + 1;
  }
  return AVar1;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    const Atom atom = XInternAtom(_glfw.x11.display, atomName, False);

    for (unsigned int i = 0;  i < atomCount;  i++)
    {
        if (supportedAtoms[i] == atom)
            return atom;
    }

    return None;
}